

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O0

int trico_read_attributes_double(void *a,double **attrib)

{
  trico_stream_type tVar1;
  ssize_t sVar2;
  uint32_t local_3c;
  uint8_t *puStack_38;
  uint32_t nr_of_doubles;
  void *compressed;
  uint32_t nr_of_compressed_bytes;
  uint32_t nr_attrib;
  trico_archive *arch;
  double **attrib_local;
  void *a_local;
  
  _nr_of_compressed_bytes = (trico_archive *)a;
  arch = (trico_archive *)attrib;
  attrib_local = (double **)a;
  tVar1 = trico_get_next_stream_type(a);
  if (tVar1 == trico_attribute_double_stream) {
    sVar2 = read((int)&compressed + 4,(void *)0x4,1);
    if ((int)sVar2 == 0) {
      a_local._4_4_ = 0;
    }
    else {
      sVar2 = read((int)&compressed,(void *)0x4,1);
      if ((int)sVar2 == 0) {
        a_local._4_4_ = 0;
      }
      else {
        puStack_38 = (uint8_t *)trico_malloc((ulong)(uint)compressed);
        sVar2 = read((int)puStack_38,(void *)0x1,(ulong)(uint)compressed);
        if ((int)sVar2 == 0) {
          a_local._4_4_ = 0;
        }
        else {
          if ((arch != (trico_archive *)0x0) &&
             (trico_decompress_double_precision(&local_3c,(double **)arch,puStack_38),
             local_3c != compressed._4_4_)) {
            __assert_fail("nr_of_doubles == nr_attrib",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                          ,0x581,"int trico_read_attributes_double(void *, double **)");
          }
          trico_free(puStack_38);
          read_next_stream_type(_nr_of_compressed_bytes);
          a_local._4_4_ = 1;
        }
      }
    }
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int trico_read_attributes_double(void* a, double** attrib)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (trico_get_next_stream_type(arch) != trico_attribute_double_stream)
    return 0;

  uint32_t nr_attrib;
  if (!read(&nr_attrib, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint32_t nr_of_doubles;

  if (attrib != NULL)
    {
    trico_decompress_double_precision(&nr_of_doubles, attrib, (const uint8_t*)compressed);
    assert(nr_of_doubles == nr_attrib);
    }

  trico_free(compressed);
  

  read_next_stream_type(arch);

  return 1;
  }